

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O2

int stbi_write_bmp(char *filename,int x,int y,int comp,void *data)

{
  int iVar1;
  undefined1 auStack_88 [8];
  stbi__write_context s;
  
  s.buffer[0x28] = '\0';
  s.buffer[0x29] = '\0';
  s.buffer[0x2a] = '\0';
  s.buffer[0x2b] = '\0';
  s.buffer[0x2c] = '\0';
  s.buffer[0x2d] = '\0';
  s.buffer[0x2e] = '\0';
  s.buffer[0x2f] = '\0';
  s.buffer[0x30] = '\0';
  s.buffer[0x31] = '\0';
  s.buffer[0x32] = '\0';
  s.buffer[0x33] = '\0';
  s.buffer[0x34] = '\0';
  s.buffer[0x35] = '\0';
  s.buffer[0x36] = '\0';
  s.buffer[0x37] = '\0';
  s.buffer[0x18] = '\0';
  s.buffer[0x19] = '\0';
  s.buffer[0x1a] = '\0';
  s.buffer[0x1b] = '\0';
  s.buffer[0x1c] = '\0';
  s.buffer[0x1d] = '\0';
  s.buffer[0x1e] = '\0';
  s.buffer[0x1f] = '\0';
  s.buffer[0x20] = '\0';
  s.buffer[0x21] = '\0';
  s.buffer[0x22] = '\0';
  s.buffer[0x23] = '\0';
  s.buffer[0x24] = '\0';
  s.buffer[0x25] = '\0';
  s.buffer[0x26] = '\0';
  s.buffer[0x27] = '\0';
  s.buffer[8] = '\0';
  s.buffer[9] = '\0';
  s.buffer[10] = '\0';
  s.buffer[0xb] = '\0';
  s.buffer[0xc] = '\0';
  s.buffer[0xd] = '\0';
  s.buffer[0xe] = '\0';
  s.buffer[0xf] = '\0';
  s.buffer[0x10] = '\0';
  s.buffer[0x11] = '\0';
  s.buffer[0x12] = '\0';
  s.buffer[0x13] = '\0';
  s.buffer[0x14] = '\0';
  s.buffer[0x15] = '\0';
  s.buffer[0x16] = '\0';
  s.buffer[0x17] = '\0';
  s.context = (void *)0x0;
  s.buffer[0] = '\0';
  s.buffer[1] = '\0';
  s.buffer[2] = '\0';
  s.buffer[3] = '\0';
  s.buffer[4] = '\0';
  s.buffer[5] = '\0';
  s.buffer[6] = '\0';
  s.buffer[7] = '\0';
  auStack_88 = (undefined1  [8])0x0;
  s.func = (stbi_write_func *)0x0;
  s.buffer[0x38] = '\0';
  s.buffer[0x39] = '\0';
  s.buffer[0x3a] = '\0';
  s.buffer[0x3b] = '\0';
  s.buffer[0x3c] = '\0';
  s.buffer[0x3d] = '\0';
  s.buffer[0x3e] = '\0';
  s.buffer[0x3f] = '\0';
  iVar1 = stbi__start_write_file((stbi__write_context *)auStack_88,filename);
  if (iVar1 == 0) {
    iVar1 = 0;
  }
  else {
    iVar1 = stbi_write_bmp_core((stbi__write_context *)auStack_88,x,y,comp,data);
    fclose((FILE *)s.func);
  }
  return iVar1;
}

Assistant:

STBIWDEF int stbi_write_bmp(char const *filename, int x, int y, int comp, const void *data)
{
   stbi__write_context s = { 0 };
   if (stbi__start_write_file(&s,filename)) {
      int r = stbi_write_bmp_core(&s, x, y, comp, data);
      stbi__end_write_file(&s);
      return r;
   } else
      return 0;
}